

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

int __thiscall
ncnn::Mat::clone(Mat *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  void *__dest;
  
  if ((*(long *)__fn == 0) ||
     (iVar1 = *(int *)(__fn + 0x38), *(long *)(__fn + 0x40) * (long)iVar1 == 0)) {
    this->cstep = 0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    *(undefined8 *)((long)&this->refcount + 4) = 0;
    *(undefined8 *)((long)&this->elemsize + 4) = 0;
    this->allocator = (Allocator *)0x0;
    this->dims = 0;
    this->w = 0;
    this->w = 0;
    this->h = 0;
    this->d = 0;
    this->c = 0;
  }
  else {
    this->cstep = 0;
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    *(undefined8 *)((long)&this->refcount + 4) = 0;
    *(undefined8 *)((long)&this->elemsize + 4) = 0;
    this->allocator = (Allocator *)0x0;
    this->dims = 0;
    this->w = 0;
    this->w = 0;
    this->h = 0;
    this->d = 0;
    this->c = 0;
    switch(*(undefined4 *)(__fn + 0x28)) {
    case 1:
      create(this,*(int *)(__fn + 0x2c),*(size_t *)(__fn + 0x10),*(int *)(__fn + 0x18),
             (Allocator *)__child_stack);
      break;
    case 2:
      create(this,*(int *)(__fn + 0x2c),*(int *)(__fn + 0x30),*(size_t *)(__fn + 0x10),
             *(int *)(__fn + 0x18),(Allocator *)__child_stack);
      break;
    case 3:
      create(this,*(int *)(__fn + 0x2c),*(int *)(__fn + 0x30),iVar1,*(size_t *)(__fn + 0x10),
             *(int *)(__fn + 0x18),(Allocator *)__child_stack);
      break;
    case 4:
      create(this,*(int *)(__fn + 0x2c),*(int *)(__fn + 0x30),*(int *)(__fn + 0x34),iVar1,
             *(size_t *)(__fn + 0x10),*(int *)(__fn + 0x18),(Allocator *)__child_stack);
    }
    __dest = this->data;
    if ((__dest != (void *)0x0) && (sVar4 = this->cstep, (long)this->c * sVar4 != 0)) {
      lVar6 = *(size_t *)(__fn + 0x40) * (long)*(int *)(__fn + 0x38);
      if (lVar6 != 0) {
        if (*(size_t *)(__fn + 0x40) == sVar4) {
          memcpy(__dest,*(void **)__fn,lVar6 * *(long *)(__fn + 0x10));
        }
        else if (0 < *(int *)(__fn + 0x38)) {
          iVar1 = *(int *)(__fn + 0x2c);
          iVar2 = *(int *)(__fn + 0x30);
          iVar3 = *(int *)(__fn + 0x34);
          lVar6 = *(long *)(__fn + 0x10);
          sVar5 = this->elemsize;
          lVar7 = 0;
          do {
            memcpy(__dest,(void *)(*(long *)(__fn + 0x40) * lVar7 * *(long *)(__fn + 0x10) +
                                  *(long *)__fn),(long)iVar3 * (long)iVar2 * (long)iVar1 * lVar6);
            lVar7 = lVar7 + 1;
            __dest = (void *)((long)__dest + sVar4 * sVar5);
          } while (lVar7 < *(int *)(__fn + 0x38));
        }
      }
    }
  }
  return (int)this;
}

Assistant:

Mat Mat::clone(Allocator* _allocator) const
{
    if (empty())
        return Mat();

    Mat m;
    if (dims == 1)
        m.create(w, elemsize, elempack, _allocator);
    else if (dims == 2)
        m.create(w, h, elemsize, elempack, _allocator);
    else if (dims == 3)
        m.create(w, h, c, elemsize, elempack, _allocator);
    else if (dims == 4)
        m.create(w, h, d, c, elemsize, elempack, _allocator);

    if (m.empty())
        return m;

    if (total() > 0)
    {
        if (cstep == m.cstep)
            memcpy(m.data, data, total() * elemsize);
        else
        {
            // copy by channel for differnet cstep
            size_t size = (size_t)w * h * d * elemsize;
            for (int i = 0; i < c; i++)
            {
                memcpy(m.channel(i), channel(i), size);
            }
        }
    }

    return m;
}